

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall find_ctx::~find_ctx(find_ctx *this)

{
  find_entry_page *__ptr;
  
  while (__ptr = this->results_head, __ptr != (find_entry_page *)0x0) {
    this->results_head = __ptr->nxt;
    free(__ptr);
  }
  return;
}

Assistant:

~find_ctx()
    {
        /* free our list of results pages */
        while (results_head != 0)
        {
            /* remember the current page */
            find_entry_page *cur = results_head;

            /* move on to the next page */
            results_head = results_head->nxt;

            /* delete the current page */
            t3free(cur);
        }
    }